

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_1::computeBinaryAtomicOperationResult
              (AtomicOperation op,int a,int b)

{
  int b_local;
  int a_local;
  AtomicOperation op_local;
  
  switch(op) {
  case ATOMIC_OPERATION_ADD:
    a_local = a + b;
    break;
  case ATOMIC_OPERATION_MIN:
    a_local = de::min<int>(a,b);
    break;
  case ATOMIC_OPERATION_MAX:
    a_local = de::max<int>(a,b);
    break;
  case ATOMIC_OPERATION_AND:
    a_local = a & b;
    break;
  case ATOMIC_OPERATION_OR:
    a_local = a | b;
    break;
  case ATOMIC_OPERATION_XOR:
    a_local = a ^ b;
    break;
  case ATOMIC_OPERATION_EXCHANGE:
    a_local = b;
    break;
  default:
    a_local = -1;
  }
  return a_local;
}

Assistant:

int computeBinaryAtomicOperationResult (AtomicOperation op, int a, int b)
{
	switch (op)
	{
		case ATOMIC_OPERATION_ADD:			return a + b;
		case ATOMIC_OPERATION_MIN:			return de::min(a, b);
		case ATOMIC_OPERATION_MAX:			return de::max(a, b);
		case ATOMIC_OPERATION_AND:			return a & b;
		case ATOMIC_OPERATION_OR:			return a | b;
		case ATOMIC_OPERATION_XOR:			return a ^ b;
		case ATOMIC_OPERATION_EXCHANGE:		return b;
		default:
			DE_ASSERT(false);
			return -1;
	}
}